

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumented_benchmark.cpp
# Opt level: O0

bool benchmarkMany(string *fn_name,uint32_t n,uint32_t m,uint32_t iterations,
                  pospopcnt_u16_method_type fn,bool verbose,bool test,bool tabular)

{
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  value_type vVar4;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  code *pcVar5;
  bool bVar6;
  uint uVar7;
  result_type rVar8;
  size_type sVar9;
  reference pvVar10;
  reference pvVar11;
  unsigned_short *puVar12;
  uint *puVar13;
  reference pvVar14;
  reference pvVar15;
  rep rVar16;
  ulong uVar17;
  undefined8 uVar18;
  reference pvVar19;
  reference pvVar20;
  reference pvVar21;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  code *in_R8;
  byte in_R9B;
  undefined8 extraout_XMM0_Qa;
  double dVar22;
  double dVar23;
  undefined8 in_XMM0_Qb;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 extraout_var [56];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 extraout_var_00 [56];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 in_ZMM3 [64];
  byte in_stack_00000008;
  byte in_stack_00000010;
  int i_1;
  double throughput;
  vector<double,_std::allocator<double>_> avg;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> mins;
  double mean_time;
  uint32_t tot_time;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> time_span;
  size_t k_4;
  size_t km_1;
  size_t k_3;
  size_t km;
  uint64_t tot_obs;
  clockdef t2;
  size_t k_2;
  clockdef t1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  flags;
  size_t k_1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  correctflags;
  size_t k2;
  size_t k;
  uint32_t i;
  bool isok;
  uniform_int_distribution<int> dis;
  mt19937 gen;
  random_device rd;
  vector<unsigned_int,_std::allocator<unsigned_int>_> times;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  allresults;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> results;
  LinuxEvents<0> unified;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *x;
  iterator __end2;
  iterator __begin2;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  *__range2;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  vdata;
  vector<int,_std::allocator<int>_> evts;
  int in_stack_ffffffffffffd388;
  int in_stack_ffffffffffffd38c;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffd390;
  allocator_type *in_stack_ffffffffffffd398;
  allocator_type *in_stack_ffffffffffffd3a0;
  size_type in_stack_ffffffffffffd3a8;
  value_type vVar34;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_stack_ffffffffffffd3b0;
  value_type vVar35;
  random_device *in_stack_ffffffffffffd3d0;
  value_type vVar36;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffd3d8;
  value_type vVar37;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffd3e0;
  value_type vVar38;
  LinuxEvents<0> *in_stack_ffffffffffffd400;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  *in_stack_ffffffffffffd408;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *this;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *in_stack_ffffffffffffd418;
  LinuxEvents<0> *in_stack_ffffffffffffd420;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffd428;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  *this_00;
  LinuxEvents<0> *in_stack_ffffffffffffd430;
  uint local_2a74;
  allocator_type local_2a50 [48];
  undefined1 local_2a20 [200];
  ulong local_2958;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_2930;
  ulong local_2918;
  ulong local_2910;
  uint local_2908;
  byte local_2901;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e8;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  local_1d0 [11];
  undefined4 local_c8;
  undefined4 local_c4;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined4 local_b8;
  undefined4 local_b4;
  reference local_b0;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_a8;
  __normal_iterator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>
  local_a0;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  *local_98;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  local_60;
  vector<int,_std::allocator<int>_> local_48;
  byte local_2b;
  byte local_2a;
  byte local_29;
  code *local_28;
  uint local_1c;
  uint local_18;
  uint local_14;
  byte local_1;
  undefined1 auVar28 [64];
  undefined1 auVar31 [64];
  
  local_29 = in_R9B & 1;
  local_2a = in_stack_00000008 & 1;
  local_2b = in_stack_00000010 & 1;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x17f96c);
  std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)0x17f99f);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_ffffffffffffd3b0,
             in_stack_ffffffffffffd3a8,in_stack_ffffffffffffd3a0);
  std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>::allocator
            ((allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_> *)0x17f9d3);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::vector((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
            *)in_stack_ffffffffffffd3b0,in_stack_ffffffffffffd3a8,
           (value_type *)in_stack_ffffffffffffd3a0,in_stack_ffffffffffffd398);
  std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>::~allocator
            ((allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_> *)0x17fa07);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_ffffffffffffd3a0);
  std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)0x17fa21);
  if (((local_29 & 1) != 0) && ((local_2b & 1) == 0)) {
    printf("alignments: ");
    local_98 = &local_60;
    local_a0._M_current =
         (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
         std::
         vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
         ::begin((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffd38c,in_stack_ffffffffffffd388));
    local_a8 = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               std::
               vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
               ::end((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                      *)CONCAT44(in_stack_ffffffffffffd38c,in_stack_ffffffffffffd388));
    while (bVar6 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>
                               *)in_stack_ffffffffffffd390._M_current,
                              (__normal_iterator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>
                               *)CONCAT44(in_stack_ffffffffffffd38c,in_stack_ffffffffffffd388)),
          bVar6) {
      local_b0 = __gnu_cxx::
                 __normal_iterator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>
                 ::operator*(&local_a0);
      puVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x17fac7);
      uVar7 = get_alignment<unsigned_short>(puVar12);
      printf("%d ",(ulong)uVar7);
      __gnu_cxx::
      __normal_iterator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>
      ::operator++(&local_a0);
    }
    printf("\n");
  }
  local_b4 = 0;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd390._M_current,
             (value_type_conflict5 *)CONCAT44(in_stack_ffffffffffffd38c,in_stack_ffffffffffffd388));
  local_b8 = 1;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd390._M_current,
             (value_type_conflict5 *)CONCAT44(in_stack_ffffffffffffd38c,in_stack_ffffffffffffd388));
  local_bc = 5;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd390._M_current,
             (value_type_conflict5 *)CONCAT44(in_stack_ffffffffffffd38c,in_stack_ffffffffffffd388));
  local_c0 = 2;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd390._M_current,
             (value_type_conflict5 *)CONCAT44(in_stack_ffffffffffffd38c,in_stack_ffffffffffffd388));
  local_c4 = 3;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd390._M_current,
             (value_type_conflict5 *)CONCAT44(in_stack_ffffffffffffd38c,in_stack_ffffffffffffd388));
  local_c8 = 9;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd390._M_current,
             (value_type_conflict5 *)CONCAT44(in_stack_ffffffffffffd38c,in_stack_ffffffffffffd388));
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffd3e0,in_stack_ffffffffffffd3d8);
  LinuxEvents<0>::LinuxEvents(in_stack_ffffffffffffd430,in_stack_ffffffffffffd428);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd3a0);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)0x17fc9d);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
            *)0x17fcaa);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x17fcb7);
  std::vector<int,_std::allocator<int>_>::size(&local_48);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::resize
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
             in_stack_ffffffffffffd3b0,in_stack_ffffffffffffd3a8);
  std::random_device::random_device(in_stack_ffffffffffffd3d0);
  std::random_device::operator()((random_device *)0x17fcf2);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)in_stack_ffffffffffffd390._M_current,
             CONCAT44(in_stack_ffffffffffffd38c,in_stack_ffffffffffffd388));
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)in_stack_ffffffffffffd390._M_current,
             in_stack_ffffffffffffd38c,in_stack_ffffffffffffd388);
  local_2901 = 1;
  for (local_2908 = 0; local_2908 < local_1c; local_2908 = local_2908 + 1) {
    for (local_2910 = 0; uVar17 = local_2910,
        sVar9 = std::
                vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                ::size(&local_60), uVar17 < sVar9; local_2910 = local_2910 + 1) {
      local_2918 = 0;
      while( true ) {
        uVar17 = local_2918;
        pvVar10 = std::
                  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                  ::operator[](&local_60,local_2910);
        sVar9 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(pvVar10);
        if (sVar9 <= uVar17) break;
        rVar8 = std::uniform_int_distribution<int>::operator()
                          ((uniform_int_distribution<int> *)in_stack_ffffffffffffd390._M_current,
                           (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                            *)CONCAT44(in_stack_ffffffffffffd38c,in_stack_ffffffffffffd388));
        pvVar10 = std::
                  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                  ::operator[](&local_60,local_2910);
        pvVar11 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                            (pvVar10,local_2918);
        *pvVar11 = (value_type)rVar8;
        local_2918 = local_2918 + 1;
      }
    }
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x17fee9);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffd3b0,
               in_stack_ffffffffffffd3a8,(allocator_type *)in_stack_ffffffffffffd3a0);
    std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
              ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x17ff1a);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::vector(in_stack_ffffffffffffd3b0,in_stack_ffffffffffffd3a8,
             (value_type *)in_stack_ffffffffffffd3a0,(allocator_type *)in_stack_ffffffffffffd398);
    std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
              ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x17ff4e);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffd3a0);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x17ff68);
    for (local_2958 = 0; local_2958 < local_18; local_2958 = local_2958 + 1) {
      std::
      vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ::operator[](&local_60,local_2958);
      puVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x17ffb1);
      pvVar10 = std::
                vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                ::operator[](&local_60,local_2958);
      sVar9 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(pvVar10);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::operator[](&local_2930,local_2958);
      puVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x17fffa);
      pospopcnt_u16_scalar_naive(puVar12,(uint32_t)sVar9,puVar13);
    }
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x1800c1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffd3b0,
               in_stack_ffffffffffffd3a8,(allocator_type *)in_stack_ffffffffffffd3a0);
    std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
              ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x1800f2);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::vector(in_stack_ffffffffffffd3b0,in_stack_ffffffffffffd3a8,
             (value_type *)in_stack_ffffffffffffd3a0,(allocator_type *)in_stack_ffffffffffffd398);
    std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
              ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x180126);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffd3a0);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x180140);
    local_2a20._136_8_ = std::chrono::_V2::system_clock::now();
    LinuxEvents<0>::start(in_stack_ffffffffffffd400);
    for (local_2a20._128_8_ = 0; pcVar5 = local_28, (ulong)local_2a20._128_8_ < (ulong)local_18;
        local_2a20._128_8_ = local_2a20._128_8_ + 1) {
      std::
      vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ::operator[](&local_60,local_2a20._128_8_);
      puVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x1801b5);
      pvVar10 = std::
                vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                ::operator[](&local_60,local_2a20._128_8_);
      sVar9 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(pvVar10);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)(local_2a20 + 0xb0),local_2a20._128_8_);
      puVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1801fe);
      (*pcVar5)(puVar12,sVar9 & 0xffffffff,puVar13);
    }
    LinuxEvents<0>::end(in_stack_ffffffffffffd420,in_stack_ffffffffffffd418);
    local_2a20._120_8_ = std::chrono::_V2::system_clock::now();
    local_2a20._112_8_ = 0;
    in_XMM0_Qb = extraout_XMM0_Qb;
    for (local_2a20._104_8_ = 0; (ulong)local_2a20._104_8_ < (ulong)local_18;
        local_2a20._104_8_ = local_2a20._104_8_ + 1) {
      for (local_2a20._96_8_ = 0; (ulong)local_2a20._96_8_ < 0x10;
          local_2a20._96_8_ = local_2a20._96_8_ + 1) {
        pvVar14 = std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                *)(local_2a20 + 0xb0),local_2a20._104_8_);
        pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (pvVar14,local_2a20._96_8_);
        local_2a20._112_8_ = (ulong)*pvVar15 + local_2a20._112_8_;
      }
    }
    if (local_2a20._112_8_ == 0) {
      local_1 = 0;
      local_2a20._92_4_ = 1;
    }
    else {
      for (local_2a20._80_8_ = 0; (ulong)local_2a20._80_8_ < (ulong)local_18;
          local_2a20._80_8_ = local_2a20._80_8_ + 1) {
        for (local_2a20._72_8_ = 0; (ulong)local_2a20._72_8_ < 0x10;
            local_2a20._72_8_ = local_2a20._72_8_ + 1) {
          pvVar14 = std::
                    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ::operator[](&local_2930,local_2a20._80_8_);
          pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (pvVar14,local_2a20._72_8_);
          vVar3 = *pvVar15;
          pvVar14 = std::
                    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                  *)(local_2a20 + 0xb0),local_2a20._80_8_);
          pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (pvVar14,local_2a20._72_8_);
          if (vVar3 != *pvVar15) {
            if ((local_2a & 1) != 0) {
              printf("bug:\n");
              printf("expected : ");
              std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::operator[](&local_2930,local_2a20._80_8_);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x180494);
              print16(in_stack_ffffffffffffd390._M_current);
              printf("got      : ");
              std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            *)(local_2a20 + 0xb0),local_2a20._80_8_);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1804cb);
              print16(in_stack_ffffffffffffd390._M_current);
              local_1 = 0;
              local_2a20._92_4_ = 1;
              goto LAB_001805e2;
            }
            local_2901 = 0;
          }
        }
      }
      std::
      vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
      ::push_back((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                   *)in_stack_ffffffffffffd3a0,(value_type *)in_stack_ffffffffffffd398);
      local_2a20._56_8_ =
           std::chrono::operator-
                     ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)in_stack_ffffffffffffd398,
                      (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)in_stack_ffffffffffffd390._M_current);
      local_2a20._64_8_ =
           std::chrono::
           duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                     ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                      CONCAT44(in_stack_ffffffffffffd38c,in_stack_ffffffffffffd388));
      rVar16 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                         ((duration<long,_std::ratio<1L,_1000000000L>_> *)(local_2a20 + 0x40));
      local_2a20._52_4_ = (undefined4)rVar16;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 in_stack_ffffffffffffd390._M_current,
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_ffffffffffffd38c,in_stack_ffffffffffffd388));
      local_2a20._92_4_ = 0;
    }
LAB_001805e2:
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)in_stack_ffffffffffffd3a0);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)in_stack_ffffffffffffd3a0);
    if (local_2a20._92_4_ != 0) goto LAB_00180eaf;
  }
  local_2a20._40_8_ =
       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  CONCAT44(in_stack_ffffffffffffd38c,in_stack_ffffffffffffd388));
  local_2a20._32_8_ =
       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  CONCAT44(in_stack_ffffffffffffd38c,in_stack_ffffffffffffd388));
  __last._M_current._4_4_ = in_stack_ffffffffffffd38c;
  __last._M_current._0_4_ = in_stack_ffffffffffffd388;
  local_2a20._48_4_ =
       std::
       accumulate<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int>
                 (in_stack_ffffffffffffd390,__last,0);
  uVar17 = (ulong)(uint)local_2a20._48_4_;
  sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_1e8);
  auVar24._0_8_ = (double)(uVar17 / sVar9);
  auVar24._8_8_ = in_XMM0_Qb;
  local_2a20._24_8_ = auVar24._0_8_;
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
            *)in_stack_ffffffffffffd3e0,
           (vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
            *)in_stack_ffffffffffffd3d8);
  compute_mins((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                *)in_stack_ffffffffffffd3d8);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
             *)in_stack_ffffffffffffd3a0);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
            *)in_stack_ffffffffffffd3e0,
           (vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
            *)in_stack_ffffffffffffd3d8);
  compute_averages(in_stack_ffffffffffffd408);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
             *)in_stack_ffffffffffffd3a0);
  auVar30 = in_ZMM3._0_16_;
  auVar24 = vcvtusi2sd_avx512f(auVar24,local_14 << 1);
  auVar32 = ZEXT816(0x41cdcd6500000000);
  auVar29._0_8_ = (double)local_2a20._24_8_ / 1000000000.0;
  auVar29._8_8_ = 0;
  auVar25._0_8_ = (auVar24._0_8_ / 1048576.0) / auVar29._0_8_;
  auVar25._8_8_ = auVar24._8_8_;
  auVar28 = ZEXT1664(auVar25);
  if ((local_2b & 1) == 0) {
    if ((local_29 & 1) == 0) {
      in_stack_ffffffffffffd390._M_current = (uint *)local_2a20;
      pvVar20 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                          ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                           in_stack_ffffffffffffd390._M_current,0);
      auVar25 = vcvtusi2sd_avx512f(auVar25,*pvVar20);
      auVar24 = vcvtusi2sd_avx512f(auVar29,local_14 * local_18);
      dVar23 = auVar25._0_8_ / auVar24._0_8_;
      pvVar20 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                          ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                           in_stack_ffffffffffffd390._M_current,5);
      auVar25 = vcvtusi2sd_avx512f(auVar24,*pvVar20);
      auVar24 = vcvtusi2sd_avx512f(auVar32,local_14 * local_18);
      printf("cycles per 16-bit word:  %4.3f; ref cycles per 16-bit word: %4.3f \n",dVar23,
             auVar25._0_8_ / auVar24._0_8_);
    }
    else {
      this = (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_2a20;
      auVar24 = auVar25;
      pvVar20 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                          (this,1);
      auVar24 = vcvtusi2sd_avx512f(auVar24,*pvVar20);
      sVar9 = 0;
      pvVar20 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                          (this,0);
      auVar29 = vcvtusi2sd_avx512f(auVar29,*pvVar20);
      auVar27._0_8_ = auVar24._0_8_ / auVar29._0_8_;
      auVar27._8_8_ = 0;
      dVar23 = auVar27._0_8_;
      pvVar20 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                          (this,sVar9);
      auVar27 = vcvtusi2sd_avx512f(auVar27,*pvVar20);
      auVar24 = vcvtusi2sd_avx512f(auVar29,local_14 * local_18);
      dVar22 = auVar27._0_8_ / auVar24._0_8_;
      pvVar20 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                          (this,1);
      auVar29 = vcvtusi2sd_avx512f(auVar32,*pvVar20);
      auVar24 = vcvtusi2sd_avx512f(auVar30,local_14 * local_18);
      printf("instructions per cycle %4.2f, cycles per 16-bit word:  %4.3f, instructions per 16-bit word %4.3f \n"
             ,dVar23,dVar22,auVar29._0_8_ / auVar24._0_8_);
      pvVar20 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                          ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                           local_2a20,0);
      vVar36 = *pvVar20;
      pvVar20 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                          ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                           local_2a20,1);
      vVar37 = *pvVar20;
      pvVar20 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                          ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                           local_2a20,2);
      vVar38 = *pvVar20;
      pvVar20 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                          ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                           local_2a20,3);
      vVar4 = *pvVar20;
      pvVar20 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                          ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                           local_2a20,4);
      printf("min: %8llu cycles, %8llu instructions, \t%8llu branch mis., %8llu cache ref., %8llu cache mis.\n"
             ,vVar36,vVar37,vVar38,vVar4,*pvVar20);
      in_stack_ffffffffffffd3a0 = local_2a50;
      pvVar21 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd3a0,0);
      vVar34 = *pvVar21;
      pvVar21 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd3a0,1);
      vVar35 = *pvVar21;
      pvVar21 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd3a0,2);
      vVar1 = *pvVar21;
      pvVar21 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd3a0,3);
      vVar2 = *pvVar21;
      pvVar21 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd3a0,4);
      printf("avg: %8.1f cycles, %8.1f instructions, \t%8.1f branch mis., %8.1f cache ref., %8.1f cache mis.\n"
             ,vVar34,vVar35,vVar1,vVar2,*pvVar21);
      printf("avg time: %f ns, %4.2f mb/s\n",local_2a20._24_8_,auVar25._0_8_);
    }
  }
  else {
    for (local_2a74 = 0; auVar24 = in_ZMM3._0_16_, local_2a74 < local_1c;
        local_2a74 = local_2a74 + 1) {
      auVar25 = vcvtusi2sd_avx512f(auVar28._0_16_,local_14 * 2);
      auVar29 = ZEXT816(0x3eb0000000000000);
      pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&local_1e8,(long)(int)local_2a74);
      auVar29 = vcvtusi2sd_avx512f(auVar29,*pvVar15);
      auVar33 = ZEXT816(0x41cdcd6500000000);
      uVar18 = std::__cxx11::string::c_str();
      auVar31._8_56_ = extraout_var_00;
      auVar31._0_8_ = extraout_XMM1_Qa;
      auVar30 = auVar31._0_16_;
      auVar28._8_56_ = extraout_var;
      auVar28._0_8_ = extraout_XMM0_Qa;
      auVar32 = auVar28._0_16_;
      printf("%s\t%u\t%d\t",uVar18,(ulong)local_14,(ulong)local_2a74);
      pvVar19 = std::
                vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                ::operator[](local_1d0,(long)(int)local_2a74);
      pvVar20 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                          (pvVar19,1);
      auVar32 = vcvtusi2sd_avx512f(auVar32,*pvVar20);
      pvVar19 = std::
                vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                ::operator[](local_1d0,(long)(int)local_2a74);
      pvVar20 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                          (pvVar19,0);
      auVar30 = vcvtusi2sd_avx512f(auVar30,*pvVar20);
      auVar26._0_8_ = auVar32._0_8_ / auVar30._0_8_;
      auVar26._8_8_ = 0;
      auVar32 = auVar26;
      pvVar19 = std::
                vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                ::operator[](local_1d0,(long)(int)local_2a74);
      pvVar20 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                          (pvVar19,0);
      auVar27 = vcvtusi2sd_avx512f(auVar32,*pvVar20);
      auVar32 = vcvtusi2sd_avx512f(auVar30,local_14 * local_18);
      pvVar19 = std::
                vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                ::operator[](local_1d0,(long)(int)local_2a74);
      pvVar20 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                          (pvVar19,1);
      auVar30 = vcvtusi2sd_avx512f(auVar33,*pvVar20);
      auVar24 = vcvtusi2sd_avx512f(auVar24,local_14 * local_18);
      in_ZMM3 = ZEXT1664(auVar24);
      printf("%4.2f\t%4.3f\t%4.3f\t",auVar26._0_8_,auVar27._0_8_ / auVar32._0_8_,
             auVar30._0_8_ / auVar24._0_8_);
      this_00 = local_1d0;
      pvVar19 = std::
                vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                ::operator[](this_00,(long)(int)local_2a74);
      pvVar20 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                          (pvVar19,0);
      vVar36 = *pvVar20;
      pvVar19 = std::
                vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                ::operator[](this_00,(long)(int)local_2a74);
      pvVar20 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                          (pvVar19,1);
      vVar37 = *pvVar20;
      pvVar19 = std::
                vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                ::operator[](this_00,(long)(int)local_2a74);
      pvVar20 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                          (pvVar19,2);
      vVar38 = *pvVar20;
      pvVar19 = std::
                vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                ::operator[](this_00,(long)(int)local_2a74);
      pvVar20 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                          (pvVar19,3);
      vVar4 = *pvVar20;
      pvVar19 = std::
                vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                ::operator[](this_00,(long)(int)local_2a74);
      pvVar20 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                          (pvVar19,4);
      printf("%llu\t%llu\t%llu\t%llu\t%llu\t",vVar36,vVar37,vVar38,vVar4,*pvVar20);
      pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&local_1e8,(long)(int)local_2a74);
      auVar28 = ZEXT864((ulong)((auVar25._0_8_ * 9.5367431640625e-07) /
                               (auVar29._0_8_ / 1000000000.0)));
      printf("%u\t%4.2f\n",(ulong)*pvVar15);
    }
  }
  local_1 = local_2901 & 1;
  local_2a20._92_4_ = 1;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd3a0);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
             in_stack_ffffffffffffd3a0);
LAB_00180eaf:
  std::random_device::~random_device((random_device *)0x180ebc);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffd3a0);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
             *)in_stack_ffffffffffffd3a0);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
             in_stack_ffffffffffffd3a0);
  LinuxEvents<0>::~LinuxEvents((LinuxEvents<0> *)in_stack_ffffffffffffd390._M_current);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
             *)in_stack_ffffffffffffd3a0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd3a0);
  return (bool)(local_1 & 1);
}

Assistant:

bool benchmarkMany(const std::string& fn_name, uint32_t n, uint32_t m, uint32_t iterations, pospopcnt_u16_method_type fn, bool verbose, bool test, bool tabular) {
    std::vector<int> evts;
#ifdef ALIGN
    std::vector<std::vector<uint16_t,AlignedSTLAllocator<uint16_t,64>>> vdata(m, std::vector<uint16_t,AlignedSTLAllocator<uint16_t,64>>(n));
#else
    std::vector<std::vector<uint16_t>> vdata(m, std::vector<uint16_t>(n));
#endif
#ifdef ALIGN
    for(auto & x : vdata) {
      assert(get_alignment(x.data()) == 64);
    }
#endif
    if(verbose && !tabular) {
      printf("alignments: ");
      for(auto & x : vdata) {
        printf("%d ", get_alignment(x.data()));
      }
      printf("\n");
    }    
    evts.push_back(PERF_COUNT_HW_CPU_CYCLES);
    evts.push_back(PERF_COUNT_HW_INSTRUCTIONS);
    evts.push_back(PERF_COUNT_HW_BRANCH_MISSES);
    evts.push_back(PERF_COUNT_HW_CACHE_REFERENCES);
    evts.push_back(PERF_COUNT_HW_CACHE_MISSES);
    evts.push_back(PERF_COUNT_HW_REF_CPU_CYCLES);
    LinuxEvents<PERF_TYPE_HARDWARE> unified(evts);
    std::vector<unsigned long long> results; // tmp buffer
    std::vector< std::vector<unsigned long long> > allresults;
    std::vector<uint32_t> times;
    results.resize(evts.size());
    
    std::random_device rd;
    std::mt19937 gen(rd());
    std::uniform_int_distribution<> dis(0, 0xFFFF);

    bool isok = true;
    for (uint32_t i = 0; i < iterations; i++) {
        for (size_t k = 0; k < vdata.size(); k++) {
            for(size_t k2 = 0; k2 < vdata[k].size() ; k2++) { 
               vdata[k][k2] = dis(gen); // random init.
            }
        }
        std::vector<std::vector<uint32_t>> correctflags(m,std::vector<uint32_t>(16));
        for (size_t k = 0; k < m; k++) {
          pospopcnt_u16_scalar_naive(vdata[k].data(), vdata[k].size(), correctflags[k].data()); // this is our gold standard
        }
        std::vector<std::vector<uint32_t>> flags(m,std::vector<uint32_t>(16));
        
        const clockdef t1 = std::chrono::high_resolution_clock::now();
        unified.start();
        for (size_t k = 0; k < m ; k++) {
          fn(vdata[k].data(), vdata[k].size(), flags[k].data());
        }
        unified.end(results);
        const clockdef t2 = std::chrono::high_resolution_clock::now();

        uint64_t tot_obs = 0;
        for (size_t km = 0; km < m; ++km)
          for (size_t k = 0; k < 16; ++k) tot_obs += flags[km][k];
        if (tot_obs == 0) { // when a method is not supported it returns all zero
            return false;
        }
        for (size_t km = 0; km < m; ++km) {
          for (size_t k = 0; k < 16; k++) {
            if (correctflags[km][k] != flags[km][k]) {
                if (test) {
                    printf("bug:\n");
                    printf("expected : ");
                    print16(correctflags[km].data());
                    printf("got      : ");
                    print16(flags[km].data());
                    return false;
                } else {
                    isok = false;
                }
            }
          }
        }
        allresults.push_back(results);

        const auto time_span = std::chrono::duration_cast<std::chrono::nanoseconds>(t2 - t1);
        times.push_back(time_span.count());
    }

    uint32_t tot_time = std::accumulate(times.begin(), times.end(), 0);
    double mean_time = tot_time / times.size();

    std::vector<unsigned long long> mins = compute_mins(allresults);
    std::vector<double> avg = compute_averages(allresults);

    double throughput = ((2*n) / (1024*1024.0)) / (mean_time / 1000000000.0);
    
    if (tabular) {
        for (int i = 0; i < iterations; ++i) {
            throughput = ((2*n) / (1024*1024.0)) / (times[i] / 1000000000.0);
            printf("%s\t%u\t%d\t", fn_name.c_str(), n, i);
            printf("%4.2f\t%4.3f\t%4.3f\t",
                    double(allresults[i][1]) / allresults[i][0], double(allresults[i][0]) / (n*m), double(allresults[i][1]) / (n*m));
            printf("%llu\t%llu\t%llu\t%llu\t%llu\t",
                    allresults[i][0], allresults[i][1], allresults[i][2], allresults[i][3], allresults[i][4]);
            printf("%u\t%4.2f\n", times[i], throughput);
        }
    } else if (verbose) {
        printf("instructions per cycle %4.2f, cycles per 16-bit word:  %4.3f, "
               "instructions per 16-bit word %4.3f \n",
                double(mins[1]) / mins[0], double(mins[0]) / (n*m), double(mins[1]) / (n*m));
        // first we display mins
        printf("min: %8llu cycles, %8llu instructions, \t%8llu branch mis., %8llu "
               "cache ref., %8llu cache mis.\n",
                mins[0], mins[1], mins[2], mins[3], mins[4]);
        printf("avg: %8.1f cycles, %8.1f instructions, \t%8.1f branch mis., %8.1f "
               "cache ref., %8.1f cache mis.\n",
                avg[0], avg[1], avg[2], avg[3], avg[4]);
        printf("avg time: %f ns, %4.2f mb/s\n", mean_time, throughput);
    } else {
        printf("cycles per 16-bit word:  %4.3f; ref cycles per 16-bit word: %4.3f \n", double(mins[0]) / (n*m), double(mins[5]) / (n*m));
    }

    return isok;
}